

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  byte *pbVar1;
  unixInodeInfo *puVar2;
  uint uVar3;
  bool bVar4;
  pid_t pVar5;
  gid_t gVar6;
  uid_t uVar7;
  _func_int_sqlite3_file_ptr *p_Var8;
  sqlite3_vfs *psVar9;
  UnixUnusedFd **ppUVar10;
  sqlite3_io_methods *psVar11;
  uint uVar12;
  __pid_t _Var13;
  int iVar14;
  uint uVar15;
  sqlite3_io_methods *psVar16;
  size_t sVar17;
  int *piVar18;
  char *zFile;
  sqlite3_mutex *psVar19;
  ulong uVar20;
  UnixUnusedFd **ppUVar21;
  uint uVar22;
  int iVar23;
  sqlite3_io_methods *psVar24;
  char *pcVar25;
  unixInodeInfo **ppuVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  gid_t gid;
  uid_t uid;
  undefined4 local_48c;
  uint *local_488;
  mode_t local_47c;
  mode_t openMode;
  char cStack_474;
  char cStack_473;
  char cStack_472;
  char cStack_471;
  undefined8 uStack_470;
  sqlite3_io_methods *local_460;
  sqlite3_vfs *local_458;
  undefined8 local_450;
  ulong local_448;
  _func_int_sqlite3_file_ptr *p_Stack_440;
  char zTmpname [514];
  
  pVar5 = randomnessPid;
  uVar12 = flags & 0xffffff00;
  if (((flags & 4U) == 0) ||
     (((local_48c = (undefined4)CONCAT71((uint7)(uint3)((uint)flags >> 8),1), uVar12 != 0x800 &&
       (uVar12 != 0x4000)) && (uVar12 != 0x80000)))) {
    local_48c = 0;
  }
  local_488 = (uint *)pOutFlags;
  _Var13 = getpid();
  if (pVar5 != _Var13) {
    randomnessPid = getpid();
    sqlite3_randomness(0,(void *)0x0);
  }
  *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
  pFile[0xe].pMethods = (sqlite3_io_methods *)0x0;
  pcVar25 = zPath;
  local_458 = pVfs;
  if (uVar12 == 0x100) {
    if (unixBigLock != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
    }
    if ((inodeList == (unixInodeInfo *)0x0) ||
       (iVar14 = (*aSyscall[4].pCurrent)(zPath,zTmpname), iVar14 != 0)) {
      psVar16 = (sqlite3_io_methods *)0x0;
    }
    else {
      psVar16 = (sqlite3_io_methods *)0x0;
      ppuVar26 = &inodeList;
      while (puVar2 = *ppuVar26, puVar2 != (unixInodeInfo *)0x0) {
        if (((puVar2->fileId).dev == zTmpname._0_8_) && ((puVar2->fileId).ino == zTmpname._8_8_)) {
          if (puVar2->pLockMutex != (sqlite3_mutex *)0x0) {
            (*sqlite3Config.mutex.xMutexEnter)(puVar2->pLockMutex);
          }
          ppUVar10 = &puVar2->pUnused;
          goto LAB_0011cfa3;
        }
        ppuVar26 = &puVar2->pNext;
      }
    }
    goto LAB_0011ca59;
  }
  uVar15 = 0xffffffff;
  if (zPath == (char *)0x0) {
    pcVar25 = zTmpname;
    uVar15 = 0xffffffff;
    iVar14 = unixGetTempname(pVfs->mxPathname,pcVar25);
    if (iVar14 != 0) {
      return iVar14;
    }
  }
  goto LAB_0011caea;
  while (ppUVar10 = (UnixUnusedFd **)&psVar16->xClose, *(int *)&psVar16->field_0x4 != flags) {
LAB_0011cfa3:
    ppUVar21 = ppUVar10;
    psVar16 = (sqlite3_io_methods *)*ppUVar21;
    if (psVar16 == (sqlite3_io_methods *)0x0) goto LAB_0011cfbe;
  }
  *ppUVar21 = (UnixUnusedFd *)psVar16->xClose;
LAB_0011cfbe:
  if (puVar2->pLockMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(puVar2->pLockMutex);
  }
LAB_0011ca59:
  if (unixBigLock != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
  }
  if (psVar16 == (sqlite3_io_methods *)0x0) {
    psVar16 = (sqlite3_io_methods *)sqlite3_malloc64(0x10);
    if (psVar16 == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    uVar15 = 0xffffffff;
  }
  else {
    uVar15 = psVar16->iVersion;
  }
  pFile[6].pMethods = psVar16;
LAB_0011caea:
  uVar20 = (ulong)(flags & 8U);
  uVar22 = flags & 1;
  iVar23 = (flags & 4U) * 0x10;
  iVar14 = iVar23 + 0x20080;
  if ((flags & 0x10U) == 0) {
    iVar14 = iVar23;
  }
  uVar3 = iVar14 + (flags & 2U);
  local_460 = (sqlite3_io_methods *)zPath;
  if ((int)uVar15 < 0) {
    _openMode = _openMode & 0xffffffff00000000;
    uid = 0;
    gid = 0;
    uVar27 = flags & 0x80800;
    local_450 = uVar20;
    if (uVar27 == 0) {
      local_47c = 0x180;
      if (((flags & 8U) == 0) && (local_47c = 0, (flags & 0x40U) != 0)) {
        zFile = sqlite3_uri_parameter(pcVar25,"modeof");
        local_47c = 0;
        if (zFile != (char *)0x0) {
          iVar14 = getFileMode(zFile,&openMode,&uid,&gid);
          goto LAB_0011ce15;
        }
      }
    }
    else {
      uVar15 = sqlite3Strlen30(pcVar25);
      iVar14 = 0;
      uVar20 = (ulong)uVar15;
      while( true ) {
        sVar17 = uVar20 - 1;
        if (pcVar25[sVar17] == '-') break;
        if ((sVar17 == 0) || (uVar20 = sVar17, pcVar25[sVar17] == '.')) goto LAB_0011ce15;
      }
      memcpy(&local_448,pcVar25,sVar17);
      *(undefined1 *)((long)&local_450 + uVar20 + 7) = 0;
      iVar14 = getFileMode((char *)&local_448,&openMode,&uid,&gid);
LAB_0011ce15:
      if (iVar14 != 0) {
        return iVar14;
      }
      local_47c = openMode;
    }
    uVar15 = robust_open(pcVar25,uVar3,local_47c);
    if (-1 < (int)uVar15) {
LAB_0011ce40:
      zPath = (char *)local_460;
      uVar7 = uid;
      gVar6 = gid;
      uVar20 = local_450;
      if ((uVar27 != 0) && (iVar14 = (*aSyscall[0x15].pCurrent)(), uVar20 = local_450, iVar14 == 0))
      {
        (*aSyscall[0x14].pCurrent)((ulong)uVar15,(ulong)uVar7,(ulong)gVar6);
        uVar20 = local_450;
      }
      goto LAB_0011cb2f;
    }
    piVar18 = __errno_location();
    if (((char)local_48c == '\0') || (*piVar18 != 0xd)) {
LAB_0011cedd:
      bVar4 = true;
      iVar14 = 0;
      if ((((flags & 2U) != 0) && (*piVar18 != 0x15)) &&
         (uVar15 = robust_open(pcVar25,uVar3 & 0x20080,local_47c), iVar14 = 0, -1 < (int)uVar15)) {
        uVar22 = 1;
        flags = (flags & 0xfffffff8U) + 1;
        goto LAB_0011ce40;
      }
    }
    else {
      bVar4 = false;
      iVar14 = (*aSyscall[2].pCurrent)(pcVar25,0);
      if (iVar14 == 0) goto LAB_0011cedd;
      iVar14 = 0x608;
    }
    iVar23 = sqlite3CantopenError(0x96a5);
    unixLogErrorAtLine(iVar23,"open",pcVar25,0x96a5);
    if (bVar4) {
      iVar14 = iVar23;
    }
LAB_0011d0b2:
    sqlite3_free(pFile[6].pMethods);
  }
  else {
LAB_0011cb2f:
    psVar9 = local_458;
    if (local_488 != (uint *)0x0) {
      *local_488 = flags;
    }
    psVar16 = pFile[6].pMethods;
    if (psVar16 != (sqlite3_io_methods *)0x0) {
      psVar16->iVersion = uVar15;
      *(int *)&psVar16->field_0x4 = flags;
    }
    iVar14 = (int)uVar20;
    if (iVar14 != 0) {
      local_488 = (uint *)CONCAT44(local_488._4_4_,flags);
      (*aSyscall[0x10].pCurrent)();
      flags = (uint)local_488;
    }
    uVar3 = iVar14 * 4 + 2;
    if (uVar22 == 0) {
      uVar3 = iVar14 * 4;
    }
    uVar22 = uVar3 + 0x80;
    if (uVar12 == 0x100) {
      uVar22 = uVar3;
    }
    uVar12 = uVar22 | 8;
    if ((char)local_48c == '\0') {
      uVar12 = uVar22;
    }
    *(uint *)&pFile[3].pMethods = uVar15;
    pFile[1].pMethods = (sqlite3_io_methods *)psVar9;
    pFile[7].pMethods = (sqlite3_io_methods *)zPath;
    *(ushort *)((long)&pFile[3].pMethods + 6) = (ushort)(flags & 0x40U) | (ushort)uVar12;
    pFile[0xc].pMethods = (sqlite3_io_methods *)sqlite3Config.szMmap;
    psVar16 = (sqlite3_io_methods *)0x0;
    if ((flags & 0x40U) != 0 || (uVar12 & 0x40) != 0) {
      psVar16 = (sqlite3_io_methods *)zPath;
    }
    iVar14 = sqlite3_uri_boolean((char *)psVar16,"psow",1);
    if (iVar14 != 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 0x10;
    }
    iVar14 = strcmp(psVar9->zName,"unix-excl");
    if (iVar14 == 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((char)uVar12 < '\0') {
      psVar16 = &nolockIoMethods;
LAB_0011cc87:
      *(undefined4 *)&pFile[4].pMethods = 0;
    }
    else {
      psVar16 = (sqlite3_io_methods *)(**psVar9->pAppData)(zPath,pFile);
      psVar24 = &posixIoMethods;
      if (psVar16 == &posixIoMethods) {
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
        }
        iVar14 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&pFile[3].pMethods,&local_448);
        if (iVar14 == 0) {
          _openMode = local_448;
          uVar20 = _openMode;
          uStack_470 = p_Stack_440;
          p_Var8 = uStack_470;
          ppuVar26 = &inodeList;
          while (psVar16 = (sqlite3_io_methods *)*ppuVar26, _openMode = uVar20, uStack_470 = p_Var8,
                psVar16 != (sqlite3_io_methods *)0x0) {
            openMode._0_1_ = (char)local_448;
            openMode._1_1_ = (char)(local_448 >> 8);
            openMode._2_1_ = (char)(local_448 >> 0x10);
            openMode._3_1_ = (char)(local_448 >> 0x18);
            cStack_474 = (char)(local_448 >> 0x20);
            cStack_473 = (char)(local_448 >> 0x28);
            cStack_472 = (char)(local_448 >> 0x30);
            cStack_471 = (char)(local_448 >> 0x38);
            uStack_470._0_1_ = (char)p_Stack_440;
            uStack_470._1_1_ = (char)((ulong)p_Stack_440 >> 8);
            uStack_470._2_1_ = (char)((ulong)p_Stack_440 >> 0x10);
            uStack_470._3_1_ = (char)((ulong)p_Stack_440 >> 0x18);
            uStack_470._4_1_ = (char)((ulong)p_Stack_440 >> 0x20);
            uStack_470._5_1_ = (char)((ulong)p_Stack_440 >> 0x28);
            uStack_470._6_1_ = (char)((ulong)p_Stack_440 >> 0x30);
            uStack_470._7_1_ = (char)((ulong)p_Stack_440 >> 0x38);
            auVar28[0] = -((char)((unixFileId *)&psVar16->iVersion)->dev == (char)openMode);
            auVar28[1] = -(*(char *)((long)&((unixFileId *)&psVar16->iVersion)->dev + 1) ==
                          openMode._1_1_);
            auVar28[2] = -(*(char *)((long)&((unixFileId *)&psVar16->iVersion)->dev + 2) ==
                          openMode._2_1_);
            auVar28[3] = -(*(char *)((long)&((unixFileId *)&psVar16->iVersion)->dev + 3) ==
                          openMode._3_1_);
            auVar28[4] = -(psVar16->field_0x4 == cStack_474);
            auVar28[5] = -(psVar16->field_0x5 == cStack_473);
            auVar28[6] = -(psVar16->field_0x6 == cStack_472);
            auVar28[7] = -(psVar16->field_0x7 == cStack_471);
            auVar28[8] = -(*(char *)&psVar16->xClose == (char)uStack_470);
            auVar28[9] = -(*(char *)((long)&psVar16->xClose + 1) == uStack_470._1_1_);
            auVar28[10] = -(*(char *)((long)&psVar16->xClose + 2) == uStack_470._2_1_);
            auVar28[0xb] = -(*(char *)((long)&psVar16->xClose + 3) == uStack_470._3_1_);
            auVar28[0xc] = -(*(char *)((long)&psVar16->xClose + 4) == uStack_470._4_1_);
            auVar28[0xd] = -(*(char *)((long)&psVar16->xClose + 5) == uStack_470._5_1_);
            auVar28[0xe] = -(*(char *)((long)&psVar16->xClose + 6) == uStack_470._6_1_);
            auVar28[0xf] = -(*(char *)((long)&psVar16->xClose + 7) == uStack_470._7_1_);
            if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar28[0xf] >> 7) << 0xf) == 0xffff) {
              *(int *)&psVar16->xFileSize = *(int *)&psVar16->xFileSize + 1;
              psVar11 = (sqlite3_io_methods *)inodeList;
              goto LAB_0011d073;
            }
            ppuVar26 = (unixInodeInfo **)&psVar16->xUnlock;
          }
          psVar16 = (sqlite3_io_methods *)sqlite3_malloc64(0x50);
          iVar14 = 7;
          if (psVar16 == (sqlite3_io_methods *)0x0) goto LAB_0011cd39;
          *(undefined1 (*) [16])&psVar16->xUnlock = (undefined1  [16])0x0;
          psVar16->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
          psVar16->xLock = (_func_int_sqlite3_file_ptr_int *)0x0;
          psVar16->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
          psVar16->xSync = (_func_int_sqlite3_file_ptr_int *)0x0;
          *(undefined1 (*) [16])&psVar16->xRead = (undefined1  [16])0x0;
          *(ulong *)psVar16 = _openMode;
          psVar16->xClose = uStack_470;
          if (sqlite3Config.bCoreMutex != 0) {
            psVar19 = sqlite3_mutex_alloc(0);
            psVar16->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)psVar19;
            if (psVar19 == (sqlite3_mutex *)0x0) {
              sqlite3_free(psVar16);
              goto LAB_0011cd39;
            }
          }
          *(int *)&psVar16->xFileSize = 1;
          psVar16->xUnlock = (_func_int_sqlite3_file_ptr_int *)inodeList;
          psVar16->xCheckReservedLock = (_func_int_sqlite3_file_ptr_int_ptr *)0x0;
          psVar11 = psVar16;
          if (inodeList != (unixInodeInfo *)0x0) {
            inodeList->pPrev = (unixInodeInfo *)psVar16;
          }
LAB_0011d073:
          inodeList = (unixInodeInfo *)psVar11;
          pFile[2].pMethods = psVar16;
          iVar14 = 0;
        }
        else {
          piVar18 = __errno_location();
          *(int *)&pFile[4].pMethods = *piVar18;
          iVar14 = 10;
LAB_0011cd39:
          robust_close((unixFile *)pFile,uVar15,0x94b3);
          uVar15 = 0xffffffff;
        }
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
        }
      }
      else {
        psVar24 = &dotlockIoMethods;
        if (psVar16 != &dotlockIoMethods) goto LAB_0011cc87;
        sVar17 = strlen(zPath);
        iVar23 = (int)sVar17 + 6;
        psVar16 = (sqlite3_io_methods *)sqlite3_malloc64((long)iVar23);
        if (psVar16 == (sqlite3_io_methods *)0x0) {
          iVar14 = 7;
        }
        else {
          iVar14 = 0;
          sqlite3_snprintf(iVar23,(char *)psVar16,"%s.lock",zPath);
        }
        pFile[5].pMethods = psVar16;
      }
      *(undefined4 *)&pFile[4].pMethods = 0;
      psVar16 = psVar24;
      if (iVar14 != 0) {
        if (-1 < (int)uVar15) {
          robust_close((unixFile *)pFile,uVar15,0x9508);
        }
        goto LAB_0011d0b2;
      }
    }
    pFile->pMethods = psVar16;
    verifyDbFile((unixFile *)pFile);
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0xFFFFFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int isNewJrnl = (isCreate && (
        eType==SQLITE_OPEN_MASTER_JOURNAL 
     || eType==SQLITE_OPEN_MAIN_JOURNAL 
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true: 
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and 
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and master journal are never 
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MASTER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB 
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL 
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_MASTER_JOURNAL 
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }
  memset(p, 0, sizeof(unixFile));

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pPreallocatedUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !isNewJrnl);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pPreallocatedUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 ){
      if( isNewJrnl && errno==EACCES && osAccess(zName, F_OK) ){
        /* If unable to create a journal because the directory is not
        ** writable, change the error code to indicate that. */
        rc = SQLITE_READONLY_DIRECTORY;
      }else if( errno!=EISDIR && isReadWrite ){
        /* Failed to open the file for read/write access. Try read-only. */
        flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
        openFlags &= ~(O_RDWR|O_CREAT);
        flags |= SQLITE_OPEN_READONLY;
        openFlags |= O_RDONLY;
        isReadonly = 1;
        fd = robust_open(zName, openFlags, openMode);
      }
    }
    if( fd<0 ){
      int rc2 = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      if( rc==SQLITE_OK ) rc = rc2;
      goto open_finished;
    }

    /* If this process is running as root and if creating a new rollback
    ** journal or WAL file, set the ownership of the journal or WAL to be
    ** the same as the original database.
    */
    if( flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL) ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pPreallocatedUnused ){
    p->pPreallocatedUnused->fd = fd;
    p->pPreallocatedUnused->flags = flags;
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif
  
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( isNewJrnl )               ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means 
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile 
          ** and clear all the structure's references.  Specifically, 
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op 
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif
  
  assert( zPath==0 || zPath[0]=='/' 
      || eType==SQLITE_OPEN_MASTER_JOURNAL || eType==SQLITE_OPEN_MAIN_JOURNAL 
  );
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pPreallocatedUnused);
  }
  return rc;
}